

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash3.cpp
# Opt level: O1

void MurmurHash3_x86_32(void *key,int len,uint32_t seed,void *out)

{
  byte *pbVar1;
  uint uVar2;
  uint8_t *data;
  long lVar3;
  uint uVar4;
  
  uVar4 = len;
  if (len < 0) {
    uVar4 = len + 3U;
  }
  pbVar1 = (byte *)((long)(int)(uVar4 & 0xfffffffc) + (long)key);
  if (6 < len + 3U) {
    lVar3 = (long)-((int)uVar4 >> 2);
    do {
      uVar4 = ((uint)(*(int *)(pbVar1 + lVar3 * 4) * -0x3361d2af) >> 0x11 |
              *(int *)(pbVar1 + lVar3 * 4) * 0x16a88000) * 0x1b873593 ^ seed;
      seed = (uVar4 << 0xd | uVar4 >> 0x13) * 5 + 0xe6546b64;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
  }
  uVar2 = 0;
  uVar4 = 0;
  switch(len & 3) {
  case 3:
    uVar4 = (uint)pbVar1[2] << 0x10;
  case 2:
    uVar2 = uVar4 | (uint)pbVar1[1] << 8;
  case 1:
    seed = seed ^ ((*pbVar1 ^ uVar2) * -0x3361d2af >> 0x11 | (*pbVar1 ^ uVar2) * 0x16a88000) *
                  0x1b873593;
  case 0:
    uVar4 = ((seed ^ len) >> 0x10 ^ seed ^ len) * -0x7a143595;
    uVar4 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
    *(uint *)out = uVar4 >> 0x10 ^ uVar4;
    return;
  }
}

Assistant:

void MurmurHash3_x86_32 ( const void * key, int len,
                          uint32_t seed, void * out )
{
  const uint8_t * data = (const uint8_t*)key;
  const int nblocks = len / 4;

  uint32_t h1 = seed;

  const uint32_t c1 = 0xcc9e2d51;
  const uint32_t c2 = 0x1b873593;

  //----------
  // body

  const uint32_t * blocks = (const uint32_t *)(data + nblocks*4);

  for(int i = -nblocks; i; i++)
  {
    uint32_t k1 = getblock32(blocks,i);

    k1 *= c1;
    k1 = ROTL32(k1,15);
    k1 *= c2;
    
    h1 ^= k1;
    h1 = ROTL32(h1,13); 
    h1 = h1*5+0xe6546b64;
  }

  //----------
  // tail

  const uint8_t * tail = (const uint8_t*)(data + nblocks*4);

  uint32_t k1 = 0;

  switch(len & 3)
  {
  case 3: k1 ^= tail[2] << 16;
  case 2: k1 ^= tail[1] << 8;
  case 1: k1 ^= tail[0];
          k1 *= c1; k1 = ROTL32(k1,15); k1 *= c2; h1 ^= k1;
  };

  //----------
  // finalization

  h1 ^= len;

  h1 = fmix32(h1);

  *(uint32_t*)out = h1;
}